

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O1

kiss_fftnd_cfg kiss_fftnd_alloc(int *dims,int ndims,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  int *piVar1;
  kiss_fft_cfg pkVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  kiss_fft_cpx *mem_00;
  long lVar6;
  size_t sublen;
  size_t local_48;
  size_t *local_40;
  ulong local_38;
  
  local_38 = (ulong)(uint)ndims;
  local_40 = lenmem;
  if (ndims < 1) {
    lVar6 = 0x20;
    iVar5 = 1;
  }
  else {
    iVar5 = 1;
    lVar6 = 0x20;
    uVar4 = 0;
    do {
      local_48 = 0;
      kiss_fft_alloc(dims[uVar4],inverse_fft,(void *)0x0,&local_48);
      lVar6 = lVar6 + local_48;
      iVar5 = iVar5 * dims[uVar4];
      uVar4 = uVar4 + 1;
    } while (local_38 != uVar4);
  }
  lVar3 = (long)ndims;
  __size = lVar6 + lVar3 * 0xc + (long)iVar5 * 8;
  if (local_40 == (size_t *)0x0) {
    mem = malloc(__size);
  }
  else {
    if (*local_40 < __size) {
      mem = (kiss_fftnd_cfg)0x0;
    }
    *local_40 = __size;
  }
  if ((kiss_fftnd_cfg)mem == (kiss_fftnd_cfg)0x0) {
    mem = (kiss_fftnd_cfg)0x0;
  }
  else {
    ((kiss_fftnd_cfg)mem)->dimprod = iVar5;
    ((kiss_fftnd_cfg)mem)->ndims = ndims;
    piVar1 = &((kiss_fftnd_cfg)((long)mem + 0x20))->dimprod + lVar3 * 2;
    ((kiss_fftnd_cfg)mem)->states = (kiss_fft_cfg *)((long)mem + 0x20);
    ((kiss_fftnd_cfg)mem)->dims = piVar1;
    ((kiss_fftnd_cfg)mem)->tmpbuf = (kiss_fft_cpx *)(piVar1 + lVar3);
    mem_00 = (kiss_fft_cpx *)(piVar1 + lVar3) + iVar5;
    local_40 = (size_t *)__size;
    if (0 < ndims) {
      uVar4 = 0;
      do {
        iVar5 = dims[uVar4];
        ((kiss_fftnd_cfg)mem)->dims[uVar4] = iVar5;
        kiss_fft_alloc(iVar5,inverse_fft,(void *)0x0,&local_48);
        pkVar2 = kiss_fft_alloc(((kiss_fftnd_cfg)mem)->dims[uVar4],inverse_fft,mem_00,&local_48);
        ((kiss_fftnd_cfg)mem)->states[uVar4] = pkVar2;
        mem_00 = (kiss_fft_cpx *)((long)&mem_00->r + local_48);
        uVar4 = uVar4 + 1;
      } while (local_38 != uVar4);
    }
    if ((long)mem_00 - (long)mem != (long)(int)local_40) {
      kiss_fftnd_alloc_cold_1();
    }
  }
  return (kiss_fftnd_cfg)mem;
}

Assistant:

kiss_fftnd_cfg kiss_fftnd_alloc(const int *dims,int ndims,int inverse_fft,void*mem,size_t*lenmem)
{
    kiss_fftnd_cfg st = NULL;
    int i;
    int dimprod=1;
    size_t memneeded = sizeof(struct kiss_fftnd_state);
    char * ptr;

    for (i=0;i<ndims;++i) {
        size_t sublen=0;
        kiss_fft_alloc (dims[i], inverse_fft, NULL, &sublen);
        memneeded += sublen;   /* st->states[i] */
        dimprod *= dims[i];
    }
    memneeded += sizeof(int) * ndims;/*  st->dims */
    memneeded += sizeof(void*) * ndims;/* st->states  */
    memneeded += sizeof(kiss_fft_cpx) * dimprod; /* st->tmpbuf */

    if (lenmem == NULL) {/* allocate for the caller*/
        st = (kiss_fftnd_cfg) malloc (memneeded);
    } else { /* initialize supplied buffer if big enough */
        if (*lenmem >= memneeded)
            st = (kiss_fftnd_cfg) mem;
        *lenmem = memneeded; /*tell caller how big struct is (or would be) */
    }
    if (!st)
        return NULL; /*malloc failed or buffer too small */

    st->dimprod = dimprod;
    st->ndims = ndims;
    ptr=(char*)(st+1);

    st->states = (kiss_fft_cfg *)ptr;
    ptr += sizeof(void*) * ndims;

    st->dims = (int*)ptr;
    ptr += sizeof(int) * ndims;

    st->tmpbuf = (kiss_fft_cpx*)ptr;
    ptr += sizeof(kiss_fft_cpx) * dimprod;

    for (i=0;i<ndims;++i) {
        size_t len;
        st->dims[i] = dims[i];
        kiss_fft_alloc (st->dims[i], inverse_fft, NULL, &len);
        st->states[i] = kiss_fft_alloc (st->dims[i], inverse_fft, ptr,&len);
        ptr += len;
    }
    /*
Hi there!

If you're looking at this particular code, it probably means you've got a brain-dead bounds checker 
that thinks the above code overwrites the end of the array.

It doesn't.

-- Mark 

P.S.
The below code might give you some warm fuzzies and help convince you.
       */
    if ( ptr - (char*)st != (int)memneeded ) {
        fprintf(stderr,
                "################################################################################\n"
                "Internal error! Memory allocation miscalculation\n"
                "################################################################################\n"
               );
    }
    return st;
}